

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall
wabt::AST::Block<(wabt::ExprType)8>(AST *this,BlockExprBase<(wabt::ExprType)8> *be,LabelType label)

{
  ModuleContext::BeginBlock(this->mc,label,&be->block);
  Construct(this,&(be->block).exprs,
            (Index)((ulong)((long)*(pointer *)
                                   ((long)&(be->block).decl.sig.result_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(be->block).decl.sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3),
            (Index)((ulong)((long)*(pointer *)
                                   ((long)&(be->block).decl.sig.param_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(be->block).decl.sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3),false);
  ModuleContext::EndBlock(this->mc);
  InsertNode(this,Expr,Block,(Expr *)be,1);
  return;
}

Assistant:

void Block(const BlockExprBase<T>& be, LabelType label) {
    mc.BeginBlock(label, be.block);
    Construct(be.block.exprs, be.block.decl.GetNumResults(),
              be.block.decl.GetNumParams(), false);
    mc.EndBlock();
    InsertNode(NodeType::Expr, T, &be, 1);
  }